

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex_*>::erase
          (QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex_*> *this,AnchorVertex **b,qsizetype n)

{
  Data **__src;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *pQVar1;
  AnchorVertex **ppAVar2;
  long in_RDX;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *in_RSI;
  long in_RDI;
  AnchorVertex **e;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *in_stack_ffffffffffffffb0;
  
  __src = &in_RSI->d + in_RDX;
  pQVar1 = (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
           QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::begin
                     ((QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x95e546);
  if ((in_RSI == pQVar1) &&
     (ppAVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                          (in_stack_ffffffffffffffb0), (AnchorVertex **)__src != ppAVar2)) {
    *(Data ***)(in_RDI + 8) = __src;
  }
  else {
    ppAVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                        (in_stack_ffffffffffffffb0);
    if ((AnchorVertex **)__src != ppAVar2) {
      ppAVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::end(in_RSI);
      memmove(in_RSI,__src,((long)ppAVar2 - (long)__src >> 3) << 3);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }